

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::LocalSingleBlockLoadStoreElim
          (LocalSingleBlockLoadStoreElimPass *this,Function *func)

{
  __node_base_ptr *this_00;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  size_type sVar6;
  DebugInfoManager *this_01;
  pointer ppVar7;
  mapped_type *ppIVar8;
  reference ppIVar9;
  IRContext *pIVar10;
  pair<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_bool> pVar11;
  byte local_175;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_140;
  undefined1 local_138;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_130;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_128;
  iterator si_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_118;
  iterator li_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_108;
  iterator si;
  uint32_t replId;
  Instruction *ptrInst_1;
  Instruction *pIStack_e8;
  uint32_t varId_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_e0;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_d8;
  iterator li;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> _Stack_c8;
  bool kill_store;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false> local_c0;
  iterator prev_store;
  Instruction *ptrInst;
  undefined1 local_a8 [4];
  uint32_t varId;
  iterator_template<spvtools::opt::Instruction> local_a0;
  iterator ii;
  iterator next;
  undefined1 local_80 [8];
  iterator bi;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_save;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_kill;
  bool modified;
  Function *func_local;
  LocalSingleBlockLoadStoreElimPass *this_local;
  
  instructions_to_kill.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = false;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &instructions_to_save._M_h._M_single_bucket);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&bi.iterator_);
  _local_80 = opt::Function::begin(func);
  do {
    _next = opt::Function::end(func);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_80,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&next);
    if (!bVar1) {
      this_00 = &instructions_to_save._M_h._M_single_bucket;
      __end2 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)this_00);
      inst = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                         *)&inst), bVar1) {
        ppIVar9 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end2);
        pIVar5 = *ppIVar9;
        pIVar10 = Pass::context((Pass *)this);
        IRContext::KillInst(pIVar10,pIVar5);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end2);
      }
      std::
      unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)&bi.iterator_);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&instructions_to_save._M_h._M_single_bucket);
      return instructions_to_kill.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    }
    std::
    unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
    ::clear(&this->var2store_);
    std::
    unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
    ::clear(&this->var2load_);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_80);
    BasicBlock::begin((BasicBlock *)&ii);
    InstructionList::iterator::iterator((iterator *)&local_a0,&ii);
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_80);
      BasicBlock::end((BasicBlock *)local_a8);
      bVar1 = utils::operator!=(&local_a0,(iterator_template<spvtools::opt::Instruction> *)local_a8)
      ;
      if (!bVar1) break;
      InstructionList::iterator::operator++(&ii);
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->(&local_a0);
      OVar2 = opt::Instruction::opcode(pIVar5);
      if (OVar2 == OpFunctionCall) {
        std::
        unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
        ::clear(&this->var2store_);
        std::
        unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
        ::clear(&this->var2load_);
      }
      else if (OVar2 == OpLoad) {
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
        pIVar5 = MemPass::GetPtr(&this->super_MemPass,pIVar5,(uint32_t *)((long)&ptrInst_1 + 4));
        bVar1 = MemPass::IsTargetVar(&this->super_MemPass,ptrInst_1._4_4_);
        if ((bVar1) && (bVar1 = HasOnlySupportedRefs(this,ptrInst_1._4_4_), bVar1)) {
          si.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
          ._M_cur._4_4_ = 0;
          OVar2 = opt::Instruction::opcode(pIVar5);
          if (OVar2 == OpVariable) {
            local_108._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::find(&this->var2store_,(key_type *)((long)&ptrInst_1 + 4));
            li_1 = std::
                   unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   ::end(&this->var2store_);
            bVar1 = std::__detail::operator!=
                              (&local_108,
                               &li_1.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                              );
            if (bVar1) {
              ppVar7 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                                     *)&local_108);
              si.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
              ._M_cur._4_4_ = opt::Instruction::GetSingleWordInOperand(ppVar7->second,1);
            }
            else {
              local_118._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   ::find(&this->var2load_,(key_type *)((long)&ptrInst_1 + 4));
              si_1 = std::
                     unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                     ::end(&this->var2load_);
              bVar1 = std::__detail::operator!=
                                (&local_118,
                                 &si_1.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                );
              if (bVar1) {
                ppVar7 = std::__detail::
                         _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                         ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                                       *)&local_118);
                si.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                ._M_cur._4_4_ = opt::Instruction::result_id(ppVar7->second);
              }
            }
          }
          else {
            local_128._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::find(&this->var2store_,(key_type *)((long)&ptrInst_1 + 4));
            local_130._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::end(&this->var2store_);
            bVar1 = std::__detail::operator!=(&local_128,&local_130);
            if (bVar1) {
              ppVar7 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                                     *)&local_128);
              pVar11 = std::
                       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                       ::insert((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                                 *)&bi.iterator_,&ppVar7->second);
              local_140._M_cur =
                   (__node_type *)
                   pVar11.first.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
                   _M_cur;
              local_138 = pVar11.second;
            }
          }
          if (si.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
              ._M_cur._4_4_ == 0) {
            OVar2 = opt::Instruction::opcode(pIVar5);
            if (OVar2 == OpVariable) {
              pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
              ppIVar8 = std::
                        unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                        ::operator[](&this->var2load_,(key_type *)((long)&ptrInst_1 + 4));
              *ppIVar8 = pIVar5;
            }
          }
          else {
            pIVar10 = Pass::context((Pass *)this);
            pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
            IRContext::KillNamesAndDecorates(pIVar10,pIVar5);
            pIVar10 = Pass::context((Pass *)this);
            pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator->(&local_a0);
            uVar3 = opt::Instruction::result_id(pIVar5);
            IRContext::ReplaceAllUsesWith
                      (pIVar10,uVar3,
                       si.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                       ._M_cur._4_4_);
            __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)utils::IntrusiveList<spvtools::opt::Instruction>::
                          iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
            std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&instructions_to_save._M_h._M_single_bucket,(value_type *)&__range2);
            instructions_to_kill.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = true;
          }
        }
      }
      else if (OVar2 == OpStore) {
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
        prev_store.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                   )MemPass::GetPtr(&this->super_MemPass,pIVar5,(uint32_t *)((long)&ptrInst + 4));
        bVar1 = MemPass::IsTargetVar(&this->super_MemPass,ptrInst._4_4_);
        if ((bVar1) && (bVar1 = HasOnlySupportedRefs(this,ptrInst._4_4_), bVar1)) {
          OVar2 = opt::Instruction::opcode
                            ((Instruction *)
                             prev_store.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                             ._M_cur);
          if (OVar2 == OpVariable) {
            local_c0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::find(&this->var2store_,(key_type *)((long)&ptrInst + 4));
            _Stack_c8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::end(&this->var2store_);
            bVar1 = std::__detail::operator!=(&local_c0,&stack0xffffffffffffff38);
            local_175 = 0;
            if (bVar1) {
              ppVar7 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                                     *)&local_c0);
              sVar6 = std::
                      unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                      ::count((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                               *)&bi.iterator_,&ppVar7->second);
              local_175 = 0;
              if (sVar6 == 0) {
                pIVar10 = Pass::context((Pass *)this);
                this_01 = IRContext::get_debug_info_mgr(pIVar10);
                bVar1 = analysis::DebugInfoManager::IsVariableDebugDeclared(this_01,ptrInst._4_4_);
                local_175 = bVar1 ^ 0xff;
              }
            }
            if ((local_175 & 1) != 0) {
              ppVar7 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                                     *)&local_c0);
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&instructions_to_save._M_h._M_single_bucket,&ppVar7->second);
              instructions_to_kill.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = true;
            }
            li.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
            ._M_cur._7_1_ = 0;
            local_d8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::find(&this->var2load_,(key_type *)((long)&ptrInst + 4));
            local_e0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                 ::end(&this->var2load_);
            bVar1 = std::__detail::operator!=(&local_d8,&local_e0);
            if (bVar1) {
              pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator->(&local_a0);
              uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
              ppVar7 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false,_false>
                                     *)&local_d8);
              uVar4 = opt::Instruction::result_id(ppVar7->second);
              if (uVar3 == uVar4) {
                li.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                ._M_cur._7_1_ = 1;
              }
            }
            if ((li.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                 ._M_cur._7_1_ & 1) == 0) {
              pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
              ppIVar8 = std::
                        unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                        ::operator[](&this->var2store_,(key_type *)((long)&ptrInst + 4));
              *ppIVar8 = pIVar5;
              std::
              unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
              ::erase(&this->var2load_,(key_type *)((long)&ptrInst + 4));
            }
            else {
              pIStack_e8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                           iterator_template<spvtools::opt::Instruction>::operator*(&local_a0);
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&instructions_to_save._M_h._M_single_bucket,&stack0xffffffffffffff18);
              instructions_to_kill.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = true;
            }
          }
          else {
            OVar2 = opt::Instruction::opcode
                              ((Instruction *)
                               prev_store.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                               ._M_cur);
            bVar1 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,OVar2);
            if (!bVar1) {
              __assert_fail("IsNonPtrAccessChain(ptrInst->opcode())",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp"
                            ,0x6f,
                            "bool spvtools::opt::LocalSingleBlockLoadStoreElimPass::LocalSingleBlockLoadStoreElim(Function *)"
                           );
            }
            std::
            unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
            ::erase(&this->var2store_,(key_type *)((long)&ptrInst + 4));
            std::
            unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
            ::erase(&this->var2load_,(key_type *)((long)&ptrInst + 4));
          }
        }
      }
      InstructionList::iterator::operator=((iterator *)&local_a0,&ii);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_80);
  } while( true );
}

Assistant:

bool LocalSingleBlockLoadStoreElimPass::LocalSingleBlockLoadStoreElim(
    Function* func) {
  // Perform local store/load, load/load and store/store elimination
  // on each block
  bool modified = false;
  std::vector<Instruction*> instructions_to_kill;
  std::unordered_set<Instruction*> instructions_to_save;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    var2store_.clear();
    var2load_.clear();
    auto next = bi->begin();
    for (auto ii = next; ii != bi->end(); ii = next) {
      ++next;
      switch (ii->opcode()) {
        case spv::Op::OpStore: {
          // Verify store variable is target type
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsTargetVar(varId)) continue;
          if (!HasOnlySupportedRefs(varId)) continue;
          // If a store to the whole variable, remember it for succeeding
          // loads and stores. Otherwise forget any previous store to that
          // variable.
          if (ptrInst->opcode() == spv::Op::OpVariable) {
            // If a previous store to same variable, mark the store
            // for deletion if not still used. Don't delete store
            // if debugging; let ssa-rewrite and DCE handle it
            auto prev_store = var2store_.find(varId);
            if (prev_store != var2store_.end() &&
                instructions_to_save.count(prev_store->second) == 0 &&
                !context()->get_debug_info_mgr()->IsVariableDebugDeclared(
                    varId)) {
              instructions_to_kill.push_back(prev_store->second);
              modified = true;
            }

            bool kill_store = false;
            auto li = var2load_.find(varId);
            if (li != var2load_.end()) {
              if (ii->GetSingleWordInOperand(kStoreValIdInIdx) ==
                  li->second->result_id()) {
                // We are storing the same value that already exists in the
                // memory location.  The store does nothing.
                kill_store = true;
              }
            }

            if (!kill_store) {
              var2store_[varId] = &*ii;
              var2load_.erase(varId);
            } else {
              instructions_to_kill.push_back(&*ii);
              modified = true;
            }
          } else {
            assert(IsNonPtrAccessChain(ptrInst->opcode()));
            var2store_.erase(varId);
            var2load_.erase(varId);
          }
        } break;
        case spv::Op::OpLoad: {
          // Verify store variable is target type
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsTargetVar(varId)) continue;
          if (!HasOnlySupportedRefs(varId)) continue;
          uint32_t replId = 0;
          if (ptrInst->opcode() == spv::Op::OpVariable) {
            // If a load from a variable, look for a previous store or
            // load from that variable and use its value.
            auto si = var2store_.find(varId);
            if (si != var2store_.end()) {
              replId = si->second->GetSingleWordInOperand(kStoreValIdInIdx);
            } else {
              auto li = var2load_.find(varId);
              if (li != var2load_.end()) {
                replId = li->second->result_id();
              }
            }
          } else {
            // If a partial load of a previously seen store, remember
            // not to delete the store.
            auto si = var2store_.find(varId);
            if (si != var2store_.end()) instructions_to_save.insert(si->second);
          }
          if (replId != 0) {
            // replace load's result id and delete load
            context()->KillNamesAndDecorates(&*ii);
            context()->ReplaceAllUsesWith(ii->result_id(), replId);
            instructions_to_kill.push_back(&*ii);
            modified = true;
          } else {
            if (ptrInst->opcode() == spv::Op::OpVariable)
              var2load_[varId] = &*ii;  // register load
          }
        } break;
        case spv::Op::OpFunctionCall: {
          // Conservatively assume all locals are redefined for now.
          // TODO(): Handle more optimally
          var2store_.clear();
          var2load_.clear();
        } break;
        default:
          break;
      }
    }
  }

  for (Instruction* inst : instructions_to_kill) {
    context()->KillInst(inst);
  }

  return modified;
}